

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void setnodevector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  Node *pNVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    pNVar2 = (Node *)0x0;
LAB_0014f5de:
    t->lastfree = pNVar2;
    return;
  }
  uVar1 = luaO_ceillog2(size);
  if ((int)uVar1 < 0x1f) {
    bVar4 = (byte)uVar1;
    if (uVar1 < 0x1f) {
      pNVar2 = (Node *)luaM_malloc_(L,0x18L << (bVar4 & 0x3f),0);
      t->node = pNVar2;
      uVar3 = (ulong)(uint)(1 << (bVar4 & 0x1f));
      lVar5 = 0xc;
      uVar6 = uVar3;
      do {
        pNVar2 = t->node;
        *(undefined4 *)((long)pNVar2 + lVar5) = 0;
        *(undefined2 *)((long)pNVar2 + lVar5 + -4) = 0x10;
        lVar5 = lVar5 + 0x18;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      t->lsizenode = bVar4;
      pNVar2 = t->node + uVar3;
      goto LAB_0014f5de;
    }
  }
  luaG_runerror(L,"table overflow");
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1u << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}